

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

bool __thiscall wasm::anon_unknown_183::InfoCollector::isRelevant(InfoCollector *this,Type type)

{
  bool bVar1;
  Type *pTVar2;
  bool local_61;
  Type t;
  Iterator __end3;
  Iterator __begin3;
  Type *__range3;
  InfoCollector *local_20;
  InfoCollector *this_local;
  Type type_local;
  
  __range3._4_4_ = 1;
  local_20 = this;
  this_local = (InfoCollector *)type.id;
  bVar1 = wasm::Type::operator==((Type *)&this_local,(BasicType *)((long)&__range3 + 4));
  local_61 = true;
  if (!bVar1) {
    __range3._0_4_ = 0;
    local_61 = wasm::Type::operator==((Type *)&this_local,(BasicType *)&__range3);
  }
  if (local_61 == false) {
    bVar1 = wasm::Type::isTuple((Type *)&this_local);
    if (bVar1) {
      join_0x00000010_0x00000000_ =
           (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
           wasm::Type::begin((Type *)&this_local);
      _t = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
           wasm::Type::end((Type *)&this_local);
      while (bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                               ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                                &__end3.
                                 super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                         *)&t), bVar1) {
        pTVar2 = wasm::Type::Iterator::operator*
                           ((Iterator *)
                            &__end3.
                             super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             index);
        bVar1 = isRelevant(this,(Type)pTVar2->id);
        if (bVar1) {
          return true;
        }
        ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                  ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                   &__end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index
                  );
      }
    }
    type_local.id._7_1_ = true;
  }
  else {
    type_local.id._7_1_ = false;
  }
  return type_local.id._7_1_;
}

Assistant:

bool isRelevant(Type type) {
    if (type == Type::unreachable || type == Type::none) {
      return false;
    }
    if (type.isTuple()) {
      for (auto t : type) {
        if (isRelevant(t)) {
          return true;
        }
      }
    }
    return true;
  }